

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O1

void __thiscall QUndoGroup::addStack(QUndoGroup *this,QUndoStack *stack)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long i;
  QUndoGroup *this_00;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QUndoStack *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&this->field_0x8;
  i = *(long *)(lVar3 + 0x90);
  if (i != 0) {
    lVar4 = local_20;
    lVar5 = -8;
    do {
      lVar1 = i * -8 + lVar5;
      if (lVar1 == -8) goto LAB_0061436c;
      lVar4 = lVar5 + 8;
      plVar2 = (long *)(*(long *)(lVar3 + 0x88) + 8 + lVar5);
      lVar5 = lVar4;
    } while ((QUndoStack *)*plVar2 != stack);
    lVar4 = lVar4 >> 3;
LAB_0061436c:
    if (lVar1 != -8) goto LAB_00614379;
  }
  lVar4 = -1;
LAB_00614379:
  if (lVar4 == -1) {
    local_28 = stack;
    QtPrivate::QPodArrayOps<QUndoStack*>::emplace<QUndoStack*&>
              ((QPodArrayOps<QUndoStack*> *)(lVar3 + 0x80),i,&local_28);
    QList<QUndoStack_*>::end((QList<QUndoStack_*> *)(lVar3 + 0x80));
    this_00 = *(QUndoGroup **)(*(long *)&stack->field_0x8 + 0xb0);
    if (this_00 != (QUndoGroup *)0x0) {
      removeStack(this_00,stack);
    }
    *(QUndoGroup **)(*(long *)&stack->field_0x8 + 0xb0) = this;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUndoGroup::addStack(QUndoStack *stack)
{
    Q_D(QUndoGroup);

    if (d->stack_list.contains(stack))
        return;
    d->stack_list.append(stack);

    if (QUndoGroup *other = stack->d_func()->group)
        other->removeStack(stack);
    stack->d_func()->group = this;
}